

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble *
trng::math::detail::inv_Beta_I<long_double>(longdouble x,longdouble p,longdouble q,longdouble norm)

{
  longdouble *plVar1;
  longdouble *extraout_RAX;
  longdouble *extraout_RAX_00;
  int in_EDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  double __x;
  double __x_00;
  double dVar8;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  longdouble in_stack_00000028;
  longdouble in_stack_00000038;
  longdouble dy;
  longdouble df;
  longdouble f;
  int i;
  longdouble w;
  longdouble u;
  longdouble t;
  longdouble lnq;
  longdouble lnp;
  longdouble y;
  undefined6 in_stack_fffffffffffffe82;
  undefined2 in_stack_fffffffffffffe88;
  longdouble local_f8;
  uint local_bc;
  undefined2 in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff52;
  undefined2 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  undefined2 in_stack_ffffffffffffff68;
  undefined6 uStack_96;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  undefined2 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  undefined2 in_stack_ffffffffffffff88;
  longdouble local_68;
  
  lVar3 = in_ST3;
  lVar4 = in_ST3;
  plVar1 = std::numeric_limits<long_double>::epsilon();
  if ((in_ST0 <= in_stack_00000008) &&
     (local_68 = lVar4, plVar1 = std::numeric_limits<long_double>::epsilon(),
     in_ST1 <= (longdouble)1 - in_stack_00000008)) {
    if ((in_stack_00000018 + in_stack_00000018 < (longdouble)1) ||
       (in_stack_00000028 + in_stack_00000028 < (longdouble)1)) {
      lVar2 = local_68;
      lVar5 = local_68;
      ln((longdouble)
         CONCAT28(in_stack_fffffffffffffe88,
                  CONCAT62(in_stack_fffffffffffffe82,
                           (short)((unkuint10)
                                   (in_stack_00000018 / (in_stack_00000028 + in_stack_00000018)) >>
                                  0x40))));
      in_stack_ffffffffffffff88 = SUB102(in_ST2,0);
      in_ST2 = lVar2;
      lVar2 = lVar5;
      ln((longdouble)
         CONCAT28(in_stack_fffffffffffffe88,
                  CONCAT62(in_stack_fffffffffffffe82,
                           (short)((unkuint10)
                                   (in_stack_00000028 / (in_stack_00000018 + in_stack_00000028)) >>
                                  0x40))));
      in_stack_ffffffffffffff78 = SUB102(in_ST3,0);
      in_stack_ffffffffffffff80 = (undefined2)((unkuint10)in_ST3 >> 0x40);
      in_ST3 = lVar5;
      lVar5 = lVar2;
      dVar8 = std::exp(__x);
      lVar3 = lVar3 / in_stack_00000018;
      in_stack_ffffffffffffff68 = SUB102(lVar3,0);
      uStack_96 = (undefined6)((unkuint10)lVar3 >> 0x10);
      in_stack_ffffffffffffff70 = (undefined2)((unkuint10)lVar3 >> 0x40);
      lVar3 = lVar2;
      dVar8 = std::exp(dVar8);
      lVar4 = lVar4 / in_stack_00000028;
      in_stack_ffffffffffffff58 = SUB102(lVar4,0);
      in_stack_ffffffffffffff60 = (undefined2)((unkuint10)lVar4 >> 0x40);
      lVar4 = lVar4 + (longdouble)
                      CONCAT28(in_stack_ffffffffffffff70,
                               CONCAT62(uStack_96,in_stack_ffffffffffffff68));
      in_stack_ffffffffffffff50 = (undefined2)((unkuint10)lVar4 >> 0x40);
      if ((longdouble)
          CONCAT28(in_stack_ffffffffffffff70,CONCAT62(uStack_96,in_stack_ffffffffffffff68)) / lVar4
          <= in_stack_00000008) {
        lVar3 = in_ST3;
        lVar4 = in_ST3;
        std::pow(dVar8,in_XMM1_Qa);
        local_68 = (longdouble)1 - local_68;
        plVar1 = extraout_RAX_00;
      }
      else {
        lVar4 = lVar5;
        std::pow(dVar8,in_XMM1_Qa);
        plVar1 = extraout_RAX;
      }
    }
    else {
      lVar2 = in_stack_00000018 * (longdouble)3.0;
      local_68 = (-(longdouble)1 + lVar2) /
                 ((longdouble)-2.0 + lVar2 + in_stack_00000028 * (longdouble)3.0);
    }
    local_bc = 0;
    while ((int)local_bc < 0x40) {
      lVar2 = lVar4;
      lVar5 = lVar4;
      Beta_I<long_double>((longdouble)
                          CONCAT28(in_stack_ffffffffffffff88,
                                   CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80)),
                          (longdouble)
                          CONCAT28(in_stack_ffffffffffffff78,
                                   CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                          (longdouble)
                          CONCAT28(in_stack_ffffffffffffff68,
                                   CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
                          (longdouble)
                          CONCAT28(in_stack_ffffffffffffff58,
                                   CONCAT62(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)));
      local_f8 = in_ST2 - in_stack_00000008;
      in_ST2 = lVar5;
      dVar8 = std::pow(__x_00,in_XMM1_Qa);
      lVar7 = lVar5;
      lVar6 = lVar5;
      std::pow(dVar8,in_XMM1_Qa);
      local_f8 = local_f8 / ((in_ST3 * lVar3) / in_stack_00000038);
      in_ST3 = lVar5;
      lVar3 = lVar7;
      std::abs(in_EDI);
      plVar1 = std::numeric_limits<long_double>::epsilon();
      if (lVar4 < lVar2 + lVar2) {
        return plVar1;
      }
      for (; local_68 - local_f8 <= (longdouble)0 || (longdouble)1 <= local_68 - local_f8;
          local_f8 = (longdouble)0.75 * local_f8) {
      }
      local_68 = local_68 - local_f8;
      local_bc = local_bc + 1;
      plVar1 = (longdouble *)(ulong)local_bc;
      lVar4 = lVar6;
    }
  }
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Beta_I(T x, T p, T q, T norm) {
        if (x < numeric_limits<T>::epsilon())
          return 0;
        if (1 - x < numeric_limits<T>::epsilon())
          return 1;
        // solve via Newton method
        T y{0};
        if (2 * p >= 1 and 2 * q >= 1)
          y = (3 * p - 1) / (3 * p + 3 * q - 2);  // the approximate median
        else {
          // following initial guess given in "Numerical Recipes" by W. H. Press et al., 3rd
          // edition
          const T lnp{ln(p / (p + q))};
          const T lnq{ln(q / (p + q))};
          const T t{exp(p * lnp) / p};
          const T u{exp(q * lnq) / q};
          const T w{t + u};
          if (x < t / w)
            y = pow(p * w * x, 1 / p);
          else
            y = 1 - pow(q * w * (1 - x), 1 / q);
        }
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          const T f{Beta_I(y, p, q, norm) - x};
          const T df{pow(1 - y, q - 1) * pow(y, p - 1) / norm};
          T dy(f / df);
          if (abs(f / y) < 2 * numeric_limits<T>::epsilon())
            break;
          // avoid overshooting
          while (y - dy <= 0 or y - dy >= 1)
            dy *= T{3} / T{4};
          y -= dy;
        }
        return y;
      }